

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O1

bool __thiscall
TestTransaction::CopyVariableBufferTest
          (TestTransaction *this,string *test_data,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_array;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (buffer,test_data->_M_string_length + 10);
  cfd::core::StringUtil::StringToByte(&local_30,(string *)test_data);
  puVar2 = cfd::core::AbstractTransaction::CopyVariableBuffer
                     (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_30.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_30.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                      (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start);
  puVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != puVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (buffer,(long)((int)puVar2 - (int)puVar1));
  }
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return puVar2 != puVar1;
}

Assistant:

bool CopyVariableBufferTest(const std::string &test_data,
      std::vector<uint8_t> *buffer) {
    bool is_success = false;
    buffer->resize(test_data.length() + 10);
    std::vector<uint8_t> test_array = StringUtil::StringToByte(test_data);
    uint8_t* ptr = CopyVariableBuffer(test_array.data(), test_array.size(),
                                      buffer->data());
    if (ptr != buffer->data()) {
      int diff_size = ptr - (uint8_t*)buffer->data();
      buffer->resize(diff_size);
      is_success = true;
    }
    return is_success;
  }